

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

uint32 __thiscall
Js::PathTypeHandlerBase::ExtractSlotInfo_TTD
          (PathTypeHandlerBase *this,SnapHandlerPropertyEntry *entryInfo,
          ThreadContext *threadContext,SlabAllocator *alloc)

{
  PropertyAttributes attr_00;
  uint16 uVar1;
  uint16 uVar2;
  PropertyIndex PVar3;
  int iVar4;
  PropertyId propId;
  undefined4 extraout_var;
  TypePath *pTVar6;
  PropertyRecord *this_00;
  SnapEntryDataKindTag local_51;
  SnapEntryDataKindTag local_45;
  SnapEntryDataKindTag tag;
  PropertyId propertyId;
  ObjectSlotAttributes attr;
  uint32 index;
  ObjectSlotAttributes *attributes;
  uint32 plength;
  SlabAllocator *alloc_local;
  ThreadContext *threadContext_local;
  SnapHandlerPropertyEntry *entryInfo_local;
  PathTypeHandlerBase *this_local;
  long lVar5;
  
  uVar1 = GetPathLength(this);
  iVar4 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  for (propertyId = 0; (uint)propertyId < (uint)uVar1; propertyId = propertyId + 1) {
    if (lVar5 == 0) {
      local_51 = Setter|Getter;
    }
    else {
      local_51 = *(SnapEntryDataKindTag *)(lVar5 + (ulong)(uint)propertyId);
    }
    tag = local_51;
    pTVar6 = GetTypePath(this);
    this_00 = TypePath::GetPropertyIdUnchecked(pTVar6,propertyId);
    propId = PropertyRecord::GetPropertyId(this_00);
    if (local_51 == 0xf7) {
      pTVar6 = GetTypePath(this);
      uVar2 = GetPathLength(this);
      PVar3 = TypePath::LookupInline(pTVar6,propId,(uint)uVar2);
      tag = *(SnapEntryDataKindTag *)(lVar5 + (ulong)PVar3);
      local_45 = Setter;
    }
    else if ((local_51 & 0x10) == Clear) {
      local_45 = Data;
    }
    else {
      local_45 = Getter;
    }
    attr_00 = ObjectSlotAttributesToPropertyAttributes(tag);
    TTD::NSSnapType::ExtractSnapPropertyEntryInfo
              (entryInfo + (uint)propertyId,propId,attr_00,local_45);
  }
  return (uint)uVar1;
}

Assistant:

uint32 PathTypeHandlerBase::ExtractSlotInfo_TTD(TTD::NSSnapType::SnapHandlerPropertyEntry* entryInfo, ThreadContext* threadContext, TTD::SlabAllocator& alloc) const
    {
        uint32 plength = this->GetPathLength();
        ObjectSlotAttributes * attributes = this->GetAttributeArray();

        for(uint32 index = 0; index < plength; ++index)
        {
            ObjectSlotAttributes attr = attributes ? attributes[index] : ObjectSlotAttr_Default;
            PropertyId propertyId = GetTypePath()->GetPropertyIdUnchecked(index)->GetPropertyId();
            TTD::NSSnapType::SnapEntryDataKindTag tag;
            if (attr == ObjectSlotAttr_Setter)
            {
                attr = attributes[GetTypePath()->LookupInline(propertyId, GetPathLength())];
                tag = TTD::NSSnapType::SnapEntryDataKindTag::Setter;
            }
            else if (attr & ObjectSlotAttr_Accessor)
            {
                tag = TTD::NSSnapType::SnapEntryDataKindTag::Getter;
            }
            else
            {
                tag = TTD::NSSnapType::SnapEntryDataKindTag::Data;
            }
            TTD::NSSnapType::ExtractSnapPropertyEntryInfo(entryInfo + index, propertyId, ObjectSlotAttributesToPropertyAttributes(attr), tag);
        }

        return plength;
    }